

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilter::GenerateSigmaPoints
          (UnscentedKalmanFilter *this,VectorXd *x,MatrixXd *P,MatrixXd *Xsig)

{
  Index IVar1;
  ColXpr local_238;
  ColXpr local_210;
  ScalarMultipleReturnType local_1e8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_1b8;
  ColXpr local_178;
  ColXpr local_150;
  ScalarMultipleReturnType local_128;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_f8;
  int local_b4;
  double dStack_b0;
  int i;
  double s;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_70;
  MatrixTypeNested local_50;
  undefined1 local_48 [8];
  MatrixXd A;
  int n_x;
  MatrixXd *Xsig_local;
  MatrixXd *P_local;
  VectorXd *x_local;
  UnscentedKalmanFilter *this_local;
  
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ =
       (int)IVar1;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::llt
            (&local_70,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
  local_50 = (MatrixTypeNested)
             Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL(&local_70);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_48,
             (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
              *)&local_50);
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::~LLT(&local_70);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((ColXpr *)&s,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig,0);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&s,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
  dStack_b0 = sqrt(this->lambda_ + (double)this->n_x_);
  for (local_b4 = 0;
      local_b4 <
      A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_;
      local_b4 = local_b4 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_150,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
               (long)local_b4);
    Eigen::operator*(&local_128,&stack0xffffffffffffff50,(StorageBaseType *)&local_150);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)x,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_128);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_178,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig,
               (long)(local_b4 + 1));
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_178,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)&local_f8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_210,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
               (long)local_b4);
    Eigen::operator*(&local_1e8,&stack0xffffffffffffff50,(StorageBaseType *)&local_210);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_1b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)x,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_1e8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_238,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig,
               (long)(local_b4 + 1 +
                     A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols._4_4_));
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_238,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)&local_1b8);
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_48);
  return;
}

Assistant:

void UnscentedKalmanFilter::GenerateSigmaPoints(const VectorXd &x, const MatrixXd &P, MatrixXd &Xsig) const {

    int n_x = x.rows();

    // calculate square root of P
    MatrixXd A = P.llt().matrixL();

    //set first column of sigma point matrix
    Xsig.col(0)  = x;

    double s = sqrt(lambda_+n_x_);

    // set remaining sigma points
    for (int i = 0; i < n_x; i++) {
	Xsig.col(i+1)     = x + s * A.col(i);
        Xsig.col(i+1+n_x) = x - s * A.col(i);
    }
}